

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O3

void aom_highbd_dc_left_predictor_16x8_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  int iVar1;
  uint16_t *puVar2;
  ushort uVar3;
  ushort uVar6;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar8 [16];
  short sVar7;
  short sVar9;
  short sVar10;
  short sVar11;
  
  auVar4 = *(undefined1 (*) [16])left;
  sVar7 = auVar4._8_2_;
  auVar8._0_2_ = sVar7 + auVar4._0_2_;
  sVar9 = auVar4._10_2_;
  auVar8._2_2_ = sVar9 + auVar4._2_2_;
  sVar10 = auVar4._12_2_;
  auVar8._4_2_ = sVar10 + auVar4._4_2_;
  sVar11 = auVar4._14_2_;
  auVar8._6_2_ = sVar11 + auVar4._6_2_;
  auVar8._8_2_ = sVar7;
  auVar8._10_2_ = sVar9;
  auVar8._12_2_ = sVar10;
  auVar8._14_2_ = sVar11;
  auVar4 = pshuflw(auVar4,auVar8,0xe);
  auVar5._0_2_ = auVar4._0_2_ + auVar8._0_2_;
  auVar5._2_2_ = auVar4._2_2_ + auVar8._2_2_;
  auVar5._4_2_ = auVar4._4_2_ + auVar8._4_2_;
  auVar5._6_2_ = auVar4._6_2_ + auVar8._6_2_;
  auVar5._8_2_ = auVar4._8_2_ + sVar7;
  auVar5._10_2_ = auVar4._10_2_ + sVar9;
  auVar5._12_2_ = auVar4._12_2_ + sVar10;
  auVar5._14_2_ = auVar4._14_2_ + sVar11;
  auVar4._0_2_ = auVar5._2_2_ + auVar5._0_2_ + 4;
  auVar4._2_2_ = auVar5._2_2_;
  auVar4._4_2_ = auVar5._6_2_ + auVar5._4_2_ + 4;
  auVar4._6_2_ = auVar5._6_2_;
  auVar4._8_2_ = auVar5._10_2_ + auVar5._8_2_ + 4;
  auVar4._10_2_ = auVar5._10_2_;
  auVar4._12_2_ = auVar5._14_2_ + auVar5._12_2_ + 4;
  auVar4._14_2_ = auVar5._14_2_;
  auVar4 = pshuflw(auVar5,auVar4,0);
  uVar3 = auVar4._0_2_;
  uVar6 = auVar4._2_2_;
  puVar2 = dst + 8;
  iVar1 = 8;
  do {
    puVar2[-8] = uVar3 >> 3;
    puVar2[-7] = uVar6 >> 3;
    puVar2[-6] = uVar3 >> 3;
    puVar2[-5] = uVar6 >> 3;
    puVar2[-4] = uVar3 >> 3;
    puVar2[-3] = uVar6 >> 3;
    puVar2[-2] = uVar3 >> 3;
    puVar2[-1] = uVar6 >> 3;
    *puVar2 = uVar3 >> 3;
    puVar2[1] = uVar6 >> 3;
    puVar2[2] = uVar3 >> 3;
    puVar2[3] = uVar6 >> 3;
    puVar2[4] = uVar3 >> 3;
    puVar2[5] = uVar6 >> 3;
    puVar2[6] = uVar3 >> 3;
    puVar2[7] = uVar6 >> 3;
    puVar2 = puVar2 + stride;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void aom_highbd_dc_left_predictor_16x8_sse2(uint16_t *dst, ptrdiff_t stride,
                                            const uint16_t *above,
                                            const uint16_t *left, int bd) {
  const __m128i four = _mm_cvtsi32_si128(4);
  const __m128i sum = dc_sum_8(left);
  const __m128i dc = _mm_srli_epi16(_mm_add_epi16(sum, four), 3);
  (void)above;
  (void)bd;
  dc_store_16xh(dst, stride, 8, &dc);
}